

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

char * choc::text::FloatToStringBuffer<double>::writeAsExponentNotation
                 (char *dest,uint32_t totalLength,int exponent)

{
  char *pcVar1;
  uint uVar2;
  
  pcVar1 = dest + 1;
  if (totalLength != 1) {
    memmove(dest + 2,pcVar1,(ulong)(totalLength - 1));
    dest[1] = '.';
    do {
      uVar2 = totalLength;
      if (uVar2 < 3) break;
      totalLength = uVar2 - 1;
    } while (dest[uVar2] == '0');
    pcVar1 = dest + (uVar2 + 1);
  }
  pcVar1 = writeExponent(pcVar1,exponent);
  return pcVar1;
}

Assistant:

static char* writeAsExponentNotation (char* dest, uint32_t totalLength, int exponent)
    {
        if (totalLength == 1)
            return writeExponent (dest + 1, exponent);

        insertChar (dest + 1, totalLength - 1, '.', 1);

        while (dest[totalLength] == '0' && totalLength > 2)
            --totalLength;

        return writeExponent (dest + (totalLength + 1), exponent);
    }